

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O1

void __thiscall
AVO::Simulator::setAgentDefaults
          (Simulator *this,float neighborDist,size_t maxNeighbors,float timeHorizon,float radius,
          float maxSpeed,float maxAccel,float accelInterval,Vector2 *velocity)

{
  Agent *pAVar1;
  
  if (this->defaultAgent_ == (Agent *)0x0) {
    pAVar1 = (Agent *)operator_new(200);
    Agent::Agent(pAVar1);
    this->defaultAgent_ = pAVar1;
  }
  pAVar1 = this->defaultAgent_;
  pAVar1->accelInterval_ = accelInterval;
  pAVar1->maxAccel_ = maxAccel;
  pAVar1->maxNeighbors_ = maxNeighbors;
  pAVar1->maxSpeed_ = maxSpeed;
  pAVar1->neighborDist_ = neighborDist;
  pAVar1->radius_ = radius;
  pAVar1->timeHorizon_ = timeHorizon;
  pAVar1->velocity_ = *velocity;
  return;
}

Assistant:

void Simulator::setAgentDefaults(float neighborDist, std::size_t maxNeighbors,
                                 float timeHorizon, float radius,
                                 float maxSpeed, float maxAccel,
                                 float accelInterval, const Vector2 &velocity) {
  if (defaultAgent_ == NULL) {
    defaultAgent_ = new Agent();
  }

  assert(accelInterval >= 0.0F);
  defaultAgent_->accelInterval_ = accelInterval;
  assert(maxAccel >= 0.0F);
  defaultAgent_->maxAccel_ = maxAccel;
  defaultAgent_->maxNeighbors_ = maxNeighbors;
  assert(maxSpeed >= 0.0F);
  defaultAgent_->maxSpeed_ = maxSpeed;
  assert(neighborDist >= 0.0F);
  defaultAgent_->neighborDist_ = neighborDist;
  assert(radius >= 0.0F);
  defaultAgent_->radius_ = radius;
  assert(timeHorizon >= 0.0F);
  defaultAgent_->timeHorizon_ = timeHorizon;
  defaultAgent_->velocity_ = velocity;
}